

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTree::removeItems(QGraphicsSceneBspTree *this,QSet<QGraphicsItem_*> *items)

{
  bool bVar1;
  pointer pQVar2;
  int j;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  parameter_type local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (uVar4 = 0; uVar4 < (ulong)(this->leaves).d.size; uVar4 = uVar4 + 1) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QGraphicsItem **)0x0;
    local_58.size = 0;
    pQVar2 = QList<QList<QGraphicsItem_*>_>::data(&this->leaves);
    for (uVar3 = 0; uVar3 < (ulong)pQVar2[uVar4].d.size; uVar3 = uVar3 + 1) {
      local_60 = pQVar2[uVar4].d.ptr[uVar3];
      bVar1 = QHash<QGraphicsItem_*,_QHashDummyValue>::contains(&items->q_hash,&local_60);
      if (!bVar1) {
        QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)&local_58,local_60);
      }
    }
    pQVar2 = QList<QList<QGraphicsItem_*>_>::data(&this->leaves);
    QArrayDataPointer<QGraphicsItem_*>::operator=(&pQVar2[uVar4].d,&local_58);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::removeItems(const QSet<QGraphicsItem *> &items)
{
    for (int i = 0; i < leaves.size(); ++i) {
        QList<QGraphicsItem *> newItemList;
        const QList<QGraphicsItem *> &oldItemList = leaves[i];
        for (int j = 0; j < oldItemList.size(); ++j) {
            QGraphicsItem *item = oldItemList.at(j);
            if (!items.contains(item))
                newItemList << item;
        }
        leaves[i] = newItemList;
    }
}